

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O0

unique_ptr<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastGeneralizationsIterator,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastGeneralizationsIterator>_>
 __thiscall
Lib::
Stack<std::unique_ptr<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastGeneralizationsIterator,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastGeneralizationsIterator>_>_>
::pop(Stack<std::unique_ptr<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastGeneralizationsIterator,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastGeneralizationsIterator>_>_>
      *this)

{
  long in_RSI;
  tuple<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastGeneralizationsIterator_*,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastGeneralizationsIterator>_>
  in_RDI;
  unique_ptr<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastGeneralizationsIterator,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastGeneralizationsIterator>_>
  *res;
  unique_ptr<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastGeneralizationsIterator,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastGeneralizationsIterator>_>
  *in_stack_ffffffffffffffc8;
  __uniq_ptr_impl<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastGeneralizationsIterator,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastGeneralizationsIterator>_>
  this_00;
  
  *(long *)(in_RSI + 0x10) = *(long *)(in_RSI + 0x10) + -8;
  this_00._M_t.
  super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Indexing::LiteralClause>::FastGeneralizationsIterator_*,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastGeneralizationsIterator>_>
  .
  super__Head_base<0UL,_Indexing::SubstitutionTree<Indexing::LiteralClause>::FastGeneralizationsIterator_*,_false>
  ._M_head_impl =
       (tuple<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastGeneralizationsIterator_*,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastGeneralizationsIterator>_>
        )(tuple<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastGeneralizationsIterator_*,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastGeneralizationsIterator>_>
          )in_RDI.
           super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Indexing::LiteralClause>::FastGeneralizationsIterator_*,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastGeneralizationsIterator>_>
           .
           super__Head_base<0UL,_Indexing::SubstitutionTree<Indexing::LiteralClause>::FastGeneralizationsIterator_*,_false>
           ._M_head_impl;
  std::
  unique_ptr<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastGeneralizationsIterator,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastGeneralizationsIterator>_>
  ::unique_ptr((unique_ptr<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastGeneralizationsIterator,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastGeneralizationsIterator>_>
                *)in_RDI.
                  super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Indexing::LiteralClause>::FastGeneralizationsIterator_*,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastGeneralizationsIterator>_>
                  .
                  super__Head_base<0UL,_Indexing::SubstitutionTree<Indexing::LiteralClause>::FastGeneralizationsIterator_*,_false>
                  ._M_head_impl,in_stack_ffffffffffffffc8);
  std::
  unique_ptr<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastGeneralizationsIterator,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastGeneralizationsIterator>_>
  ::~unique_ptr((unique_ptr<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastGeneralizationsIterator,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastGeneralizationsIterator>_>
                 *)this_00._M_t.
                   super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Indexing::LiteralClause>::FastGeneralizationsIterator_*,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastGeneralizationsIterator>_>
                   .
                   super__Head_base<0UL,_Indexing::SubstitutionTree<Indexing::LiteralClause>::FastGeneralizationsIterator_*,_false>
                   ._M_head_impl);
  return (__uniq_ptr_data<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastGeneralizationsIterator,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastGeneralizationsIterator>,_true,_true>
          )(__uniq_ptr_data<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastGeneralizationsIterator,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastGeneralizationsIterator>,_true,_true>
            )in_RDI.
             super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Indexing::LiteralClause>::FastGeneralizationsIterator_*,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastGeneralizationsIterator>_>
             .
             super__Head_base<0UL,_Indexing::SubstitutionTree<Indexing::LiteralClause>::FastGeneralizationsIterator_*,_false>
             ._M_head_impl;
}

Assistant:

inline
  C pop()
  {
    ASS(_cursor > _stack);
    _cursor--;

    C res = std::move(*_cursor);
    _cursor->~C();

    return res;
  }